

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O0

char * lws_generate_client_handshake(lws *wsi,char *pkt)

{
  int iVar1;
  lws_protocols *p_00;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *conn1;
  lws_protocols *pr;
  char *p1;
  char *p;
  char *pp;
  char *meth;
  char *pkt_local;
  lws *wsi_local;
  
  meth = pkt;
  pkt_local = (char *)wsi;
  p = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
  p1 = meth;
  pp = lws_hdr_simple_ptr((lws *)pkt_local,_WSI_TOKEN_CLIENT_METHOD);
  if (pp == (char *)0x0) {
    pp = "GET";
    *(ulong *)(pkt_local + 0x2dc) =
         *(ulong *)(pkt_local + 0x2dc) & 0xffffdfffffffffff | 0x200000000000;
  }
  else {
    *(ulong *)(pkt_local + 0x2dc) = *(ulong *)(pkt_local + 0x2dc) & 0xffffdfffffffffff;
  }
  iVar1 = strcmp(pp,"RAW");
  pcVar4 = pp;
  pcVar3 = p1;
  if (iVar1 == 0) {
    lws_set_timeout((lws *)pkt_local,NO_PENDING_TIMEOUT,0);
    _lws_log(4,"client transition to raw\n");
    if (p != (char *)0x0) {
      p_00 = lws_vhost_name_to_protocol(*(lws_vhost **)(pkt_local + 0x200),p);
      if (p_00 == (lws_protocols *)0x0) {
        _lws_log(1,"protocol %s not enabled on vhost\n",p);
        return (char *)0x0;
      }
      lws_bind_protocol((lws *)pkt_local,p_00,"lws_generate_client_handshake");
    }
    iVar1 = (**(code **)(*(long *)(pkt_local + 0x228) + 8))
                      (pkt_local,0x3e,*(undefined8 *)(pkt_local + 0x268),0);
    if (iVar1 == 0) {
      lws_role_transition((lws *)pkt_local,0x10000000,LRS_ESTABLISHED,&role_ops_raw_skt);
      lws_header_table_detach((lws *)pkt_local,1);
      wsi_local = (lws *)0x0;
    }
    else {
      wsi_local = (lws *)0x0;
    }
  }
  else {
    pcVar2 = lws_hdr_simple_ptr((lws *)pkt_local,_WSI_TOKEN_CLIENT_URI);
    iVar1 = lws_snprintf(pcVar3,0x800,"%s %s HTTP/1.1\r\n",pcVar4,pcVar2);
    p1 = p1 + iVar1;
    iVar1 = lws_snprintf(p1,0x40,"Pragma: no-cache\r\nCache-Control: no-cache\r\n");
    pcVar3 = p1 + iVar1;
    p1 = pcVar3;
    pcVar4 = lws_hdr_simple_ptr((lws *)pkt_local,_WSI_TOKEN_CLIENT_HOST);
    iVar1 = lws_snprintf(pcVar3,0x80,"Host: %s\r\n",pcVar4);
    p1 = p1 + iVar1;
    pcVar4 = lws_hdr_simple_ptr((lws *)pkt_local,_WSI_TOKEN_CLIENT_ORIGIN);
    pcVar3 = p1;
    if (pcVar4 != (char *)0x0) {
      if ((*(ulong *)(*(long *)(pkt_local + 0x1f8) + 0x4c8) & 0x80000) == 0x80000) {
        pcVar4 = lws_hdr_simple_ptr((lws *)pkt_local,_WSI_TOKEN_CLIENT_ORIGIN);
        iVar1 = lws_snprintf(pcVar3,0x80,"Origin: %s\r\n",pcVar4);
        p1 = p1 + iVar1;
      }
      else {
        pcVar4 = lws_hdr_simple_ptr((lws *)pkt_local,_WSI_TOKEN_CLIENT_ORIGIN);
        iVar1 = lws_snprintf(pcVar3,0x80,"Origin: http://%s\r\n",pcVar4);
        p1 = p1 + iVar1;
      }
    }
    if (((*(uint *)(pkt_local + 0x2d4) & 0x400) == 0) ||
       (p1 = (char *)lws_http_multipart_headers((lws *)pkt_local,(uint8_t *)p1),
       (uint8_t *)p1 != (uint8_t *)0x0)) {
      if ((*(ulong *)(pkt_local + 0x2dc) >> 0x2d & 1) == 0) {
        if ((*(ulong *)(pkt_local + 0x2dc) >> 0x35 & 1) == 0) {
          iVar1 = lws_snprintf(p1,0x40,"connection: close\r\n");
          p1 = p1 + iVar1;
        }
      }
      else {
        p1 = lws_generate_client_ws_handshake((lws *)pkt_local,p1,"");
      }
      iVar1 = (**(code **)(*(long *)(pkt_local + 0x228) + 8))
                        (pkt_local,0x18,*(undefined8 *)(pkt_local + 0x268),&p1,
                         meth + ((ulong)*(uint *)(*(long *)(pkt_local + 0x1f8) + 0x4fc) - (long)p1)
                                + -0xc);
      if (iVar1 == 0) {
        if ((*(uint *)(pkt_local + 0x2d4) & 0x800) != 0) {
          iVar1 = lws_snprintf(p1,0x80,"Content-Type: application/x-www-form-urlencoded\r\n");
          p1 = p1 + iVar1;
          iVar1 = lws_snprintf(p1,0x80,"Content-Length: %lu\r\n",*(undefined8 *)(pkt_local + 0x30));
          p1 = p1 + iVar1;
          lws_client_http_body_pending((lws *)pkt_local,1);
        }
        iVar1 = lws_snprintf(p1,4,"\r\n");
        p1 = p1 + iVar1;
        if ((*(ulong *)(pkt_local + 0x2dc) >> 0x30 & 1) != 0) {
          lws_callback_on_writable((lws *)pkt_local);
        }
        wsi_local = (lws *)p1;
      }
      else {
        wsi_local = (lws *)0x0;
      }
    }
    else {
      wsi_local = (lws *)0x0;
    }
  }
  return (char *)wsi_local;
}

Assistant:

char *
lws_generate_client_handshake(struct lws *wsi, char *pkt)
{
	const char *meth, *pp = lws_hdr_simple_ptr(wsi,
				_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
	char *p = pkt, *p1;

	meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD);
	if (!meth) {
		meth = "GET";
		wsi->do_ws = 1;
	} else {
		wsi->do_ws = 0;
	}

	if (!strcmp(meth, "RAW")) {
		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);
		lwsl_notice("client transition to raw\n");

		if (pp) {
			const struct lws_protocols *pr;

			pr = lws_vhost_name_to_protocol(wsi->vhost, pp);

			if (!pr) {
				lwsl_err("protocol %s not enabled on vhost\n",
					 pp);
				return NULL;
			}

			lws_bind_protocol(wsi, pr, __func__);
		}

		if ((wsi->protocol->callback)(wsi, LWS_CALLBACK_RAW_ADOPT,
					      wsi->user_space, NULL, 0))
			return NULL;

		lws_role_transition(wsi, LWSIFR_CLIENT, LRS_ESTABLISHED,
				    &role_ops_raw_skt);
		lws_header_table_detach(wsi, 1);

		return NULL;
	}

	/*
	 * 04 example client handshake
	 *
	 * GET /chat HTTP/1.1
	 * Host: server.example.com
	 * Upgrade: websocket
	 * Connection: Upgrade
	 * Sec-WebSocket-Key: dGhlIHNhbXBsZSBub25jZQ==
	 * Sec-WebSocket-Origin: http://example.com
	 * Sec-WebSocket-Protocol: chat, superchat
	 * Sec-WebSocket-Version: 4
	 */

	p += lws_snprintf(p, 2048, "%s %s HTTP/1.1\x0d\x0a", meth,
		     lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI));

	p += lws_snprintf(p, 64, "Pragma: no-cache\x0d\x0a"
			"Cache-Control: no-cache\x0d\x0a");

	p += lws_snprintf(p, 128, "Host: %s\x0d\x0a",
		     lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_HOST));

	if (lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_ORIGIN)) {
		if (lws_check_opt(wsi->context->options,
				  LWS_SERVER_OPTION_JUST_USE_RAW_ORIGIN))
			p += lws_snprintf(p, 128, "Origin: %s\x0d\x0a",
				     lws_hdr_simple_ptr(wsi,
						     _WSI_TOKEN_CLIENT_ORIGIN));
		else
			p += lws_snprintf(p, 128, "Origin: http://%s\x0d\x0a",
				     lws_hdr_simple_ptr(wsi,
						     _WSI_TOKEN_CLIENT_ORIGIN));
	}

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = (char *)lws_http_multipart_headers(wsi, (uint8_t *)p);
		if (!p1)
			return NULL;
		p = p1;
	}

#if defined(LWS_WITH_HTTP_PROXY)
	if (wsi->parent &&
	    lws_hdr_total_length(wsi->parent, WSI_TOKEN_HTTP_CONTENT_LENGTH)) {
		p += lws_snprintf(p, 128, "Content-Length: %s\x0d\x0a",
			lws_hdr_simple_ptr(wsi->parent, WSI_TOKEN_HTTP_CONTENT_LENGTH));
		if (atoi(lws_hdr_simple_ptr(wsi->parent, WSI_TOKEN_HTTP_CONTENT_LENGTH)))
			wsi->client_http_body_pending = 1;
	}
	if (wsi->parent &&
	    lws_hdr_total_length(wsi->parent, WSI_TOKEN_HTTP_AUTHORIZATION)) {
		p += lws_snprintf(p, 128, "Authorization: %s\x0d\x0a",
			lws_hdr_simple_ptr(wsi->parent, WSI_TOKEN_HTTP_AUTHORIZATION));
	}
	if (wsi->parent &&
	    lws_hdr_total_length(wsi->parent, WSI_TOKEN_HTTP_CONTENT_TYPE)) {
		p += lws_snprintf(p, 128, "Content-Type: %s\x0d\x0a",
			lws_hdr_simple_ptr(wsi->parent, WSI_TOKEN_HTTP_CONTENT_TYPE));
	}
#endif

#if defined(LWS_ROLE_WS)
	if (wsi->do_ws) {
		const char *conn1 = "";
	//	if (!wsi->client_pipeline)
	//		conn1 = "close, ";
		p = lws_generate_client_ws_handshake(wsi, p, conn1);
	} else
#endif
	{
		if (!wsi->client_pipeline)
			p += lws_snprintf(p, 64, "connection: close\x0d\x0a");
	}

	/* give userland a chance to append, eg, cookies */

	if (wsi->protocol->callback(wsi,
			LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
			wsi->user_space, &p,
			(pkt + wsi->context->pt_serv_buf_size) - p - 12))
		return NULL;

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		p += lws_snprintf(p, 128, "Content-Type: application/x-www-form-urlencoded\x0d\x0a");
		p += lws_snprintf(p, 128, "Content-Length: %lu\x0d\x0a", wsi->http.writeable_len);
		lws_client_http_body_pending(wsi, 1);
	}

	p += lws_snprintf(p, 4, "\x0d\x0a");

	if (wsi->client_http_body_pending)
		lws_callback_on_writable(wsi);

	// puts(pkt);

	return p;
}